

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

void prvTidyWriteChar(uint c,StreamOut *out)

{
  Bool BVar1;
  uint ch_2;
  uint ch_1;
  uint ch;
  uint theChars [2];
  int numChars;
  int i;
  int count;
  StreamOut *out_local;
  uint c_local;
  
  _i = out;
  out_local._4_4_ = c;
  if (c == 10) {
    if (out->nl == 1) {
      prvTidyWriteChar(0xd,out);
    }
    else if (out->nl == 2) {
      out_local._4_4_ = 0xd;
    }
  }
  if (_i->encoding == 6) {
    EncodeMacRoman(out_local._4_4_,_i);
  }
  else if (_i->encoding == 7) {
    EncodeWin1252(out_local._4_4_,_i);
  }
  else if (_i->encoding == 8) {
    EncodeIbm858(out_local._4_4_,_i);
  }
  else if (_i->encoding == 2) {
    EncodeLatin0(out_local._4_4_,_i);
  }
  else if (_i->encoding == 4) {
    numChars = 0;
    prvTidyEncodeCharToUTF8Bytes(out_local._4_4_,(tmbstr)0x0,&_i->sink,&numChars);
    if (numChars < 1) {
      PutByte(0xef,_i);
      PutByte(0xbf,_i);
      PutByte(0xbf,_i);
    }
  }
  else if (_i->encoding == 5) {
    if (out_local._4_4_ == 0x1b) {
      _i->state = FSM_ESC;
    }
    else {
      switch(_i->state) {
      case FSM_ASCII:
        break;
      case FSM_ESC:
        if (out_local._4_4_ == 0x24) {
          _i->state = FSM_ESCD;
        }
        else if (out_local._4_4_ == 0x28) {
          _i->state = FSM_ESCP;
        }
        else {
          _i->state = FSM_ASCII;
        }
        break;
      case FSM_ESCD:
        if (out_local._4_4_ == 0x28) {
          _i->state = FSM_ESCDP;
        }
        else {
          _i->state = FSM_NONASCII;
        }
        break;
      case FSM_ESCDP:
        _i->state = FSM_NONASCII;
        break;
      case FSM_ESCP:
        _i->state = FSM_ASCII;
        break;
      case FSM_NONASCII:
        out_local._4_4_ = out_local._4_4_ & 0x7f;
      }
    }
    PutByte(out_local._4_4_,_i);
  }
  else if (((_i->encoding == 9) || (_i->encoding == 10)) || (_i->encoding == 0xb)) {
    theChars[0] = 1;
    BVar1 = prvTidyIsValidUTF16FromUCS4(out_local._4_4_);
    if (BVar1 == no) {
      out_local._4_4_ = 0;
      theChars[0] = 0;
    }
    else {
      BVar1 = prvTidyIsCombinedChar(out_local._4_4_);
      if (BVar1 == no) {
        ch_1 = out_local._4_4_;
      }
      else {
        theChars[0] = 2;
        BVar1 = prvTidySplitSurrogatePair(out_local._4_4_,&ch_1,&ch);
        if (BVar1 == no) {
          out_local._4_4_ = 0;
          theChars[0] = 0;
        }
      }
    }
    for (theChars[1] = 0; (int)theChars[1] < (int)theChars[0]; theChars[1] = theChars[1] + 1) {
      out_local._4_4_ = (&ch_1)[(int)theChars[1]];
      if (_i->encoding == 9) {
        PutByte(out_local._4_4_ & 0xff,_i);
        PutByte(out_local._4_4_ >> 8 & 0xff,_i);
      }
      else if ((_i->encoding == 10) || (_i->encoding == 0xb)) {
        PutByte(out_local._4_4_ >> 8 & 0xff,_i);
        PutByte(out_local._4_4_ & 0xff,_i);
      }
    }
  }
  else if ((_i->encoding == 0xc) || (_i->encoding == 0xd)) {
    if (out_local._4_4_ < 0x80) {
      PutByte(out_local._4_4_,_i);
    }
    else {
      PutByte(out_local._4_4_ >> 8 & 0xff,_i);
      PutByte(out_local._4_4_ & 0xff,_i);
    }
  }
  else {
    PutByte(out_local._4_4_,_i);
  }
  return;
}

Assistant:

void TY_(WriteChar)( uint c, StreamOut* out )
{
    /* Translate outgoing newlines */
    if ( LF == c )
    {
      if ( out->nl == TidyCRLF )
          TY_(WriteChar)( CR, out );
      else if ( out->nl == TidyCR )
          c = CR;
    }

    if (out->encoding == MACROMAN)
    {
        EncodeMacRoman( c, out );
    }
    else if (out->encoding == WIN1252)
    {
        EncodeWin1252( c, out );
    }
    else if (out->encoding == IBM858)
    {
        EncodeIbm858( c, out );
    }
    else if (out->encoding == LATIN0)
    {
        EncodeLatin0( c, out );
    }

    else if (out->encoding == UTF8)
    {
        int count = 0;
        
        TY_(EncodeCharToUTF8Bytes)( c, NULL, &out->sink, &count );
        if (count <= 0)
        {
            /* replacement char 0xFFFD encoded as UTF-8 */
            PutByte(0xEF, out); PutByte(0xBF, out); PutByte(0xBF, out);
        }
    }
#ifndef NO_NATIVE_ISO2022_SUPPORT
    else if (out->encoding == ISO2022)
    {
        if (c == 0x1b)  /* ESC */
            out->state = FSM_ESC;
        else
        {
            switch (out->state)
            {
            case FSM_ESC:
                if (c == '$')
                    out->state = FSM_ESCD;
                else if (c == '(')
                    out->state = FSM_ESCP;
                else
                    out->state = FSM_ASCII;
                break;

            case FSM_ESCD:
                if (c == '(')
                    out->state = FSM_ESCDP;
                else
                    out->state = FSM_NONASCII;
                break;

            case FSM_ESCDP:
                out->state = FSM_NONASCII;
                break;

            case FSM_ESCP:
                out->state = FSM_ASCII;
                break;

            case FSM_NONASCII:
                c &= 0x7F;
                break;

            case FSM_ASCII:
                break;
            }
        }

        PutByte(c, out);
    }
#endif /* NO_NATIVE_ISO2022_SUPPORT */

    else if ( out->encoding == UTF16LE ||
              out->encoding == UTF16BE ||
              out->encoding == UTF16 )
    {
        int i, numChars = 1;
        uint theChars[2];
        
        if ( !TY_(IsValidUTF16FromUCS4)(c) )
        {
            /* invalid UTF-16 value */
            c = 0;
            numChars = 0;
        }
        else if ( TY_(IsCombinedChar)(c) )
        {
            /* output both, unless something goes wrong */
            numChars = 2;
            if ( !TY_(SplitSurrogatePair)(c, &theChars[0], &theChars[1]) )
            {
                c = 0;
                numChars = 0;
            }
        }
        else
        {
            /* just put the char out */
            theChars[0] = c;
        }
        
        for (i = 0; i < numChars; i++)
        {
            c = theChars[i];
            
            if (out->encoding == UTF16LE)
            {
                uint ch = c & 0xFF; PutByte(ch, out); 
                ch = (c >> 8) & 0xFF; PutByte(ch, out); 
            }
    
            else if (out->encoding == UTF16BE || out->encoding == UTF16)
            {
                uint ch = (c >> 8) & 0xFF; PutByte(ch, out); 
                ch = c & 0xFF; PutByte(ch, out); 
            }
        }
    }
    else if (out->encoding == BIG5 || out->encoding == SHIFTJIS)
    {
        if (c < 128)
            PutByte(c, out);
        else
        {
            uint ch = (c >> 8) & 0xFF; PutByte(ch, out); 
            ch = c & 0xFF; PutByte(ch, out); 
        }
    }
    else
        PutByte( c, out );
}